

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

char * minihttp::Download(char *url,size_t *sz,POST *post)

{
  bool bVar1;
  bool local_301;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  undefined1 local_280 [8];
  DLSocket dl;
  POST *post_local;
  size_t *sz_local;
  char *url_local;
  
  dl._592_8_ = post;
  if (((_networkInitDone & 1) != 0) || (bVar1 = InitNetwork(), bVar1)) {
    DLSocket::DLSocket((DLSocket *)local_280);
    TcpSocket::SetBufsizeIn((TcpSocket *)local_280,0x10000);
    TcpSocket::SetNonBlocking((TcpSocket *)local_280,false);
    HttpSocket::SetFollowRedirect((HttpSocket *)local_280,true);
    HttpSocket::SetAlwaysHandle((HttpSocket *)local_280,false);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"minihttp",&local_2b1);
    HttpSocket::SetUserAgent((HttpSocket *)local_280,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,url,&local_2d9);
    HttpSocket::Download
              ((HttpSocket *)local_280,&local_2d8,(char *)0x0,(void *)0x0,(POST *)dl._592_8_);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    while( true ) {
      bVar1 = TcpSocket::isOpen((TcpSocket *)local_280);
      local_301 = true;
      if (!bVar1) {
        local_301 = HttpSocket::HasPendingTask((HttpSocket *)local_280);
      }
      if (local_301 == false) break;
      TcpSocket::update((TcpSocket *)local_280);
    }
    if ((((byte)dl.bufcap & 1) == 0) || ((dl.bufcap._1_1_ & 1) != 0)) {
      free((void *)dl.super_HttpSocket._560_8_);
      url_local = (char *)0x0;
    }
    else {
      if (sz != (size_t *)0x0) {
        *sz = (size_t)dl.buf;
      }
      url_local = (char *)dl.super_HttpSocket._560_8_;
    }
    DLSocket::~DLSocket((DLSocket *)local_280);
  }
  else {
    url_local = (char *)0x0;
  }
  return url_local;
}

Assistant:

char *Download(const char *url, size_t *sz, const POST *post /* = NULL */)
{
    if(!_networkInitDone)
        if(!InitNetwork())
            return NULL;

    DLSocket dl;
    dl.SetBufsizeIn(64 * 1024);
    dl.SetNonBlocking(false);
    dl.SetFollowRedirect(true);
    dl.SetAlwaysHandle(false);
    dl.SetUserAgent("minihttp");
    dl.Download(url, NULL, NULL, post);

    while(dl.isOpen() || dl.HasPendingTask())
        dl.update();

    if(!dl.finished || dl.fail)
    {
        free(dl.buf);
        return NULL;
    }

    if(sz)
        *sz = dl.bufsz;

    // FIXME: if the body is empty (aka the HTTP reply contained entirely of headers only), buf was not allocated and is still NULL.
    // Might want to return 1 malloc'd zero byte in that case?
    return dl.buf;
}